

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_ManLevelNum(Gia_Man_t *p)

{
  Gia_Obj_t *pObj;
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  int iVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar7;
  int extraout_EDX_01;
  int extraout_EDX_02;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  Gia_ManCleanLevels(p,p->nObjs);
  p->nLevels = 0;
  uVar5 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pObj = (Gia_Obj_t *)(&pGVar2->field_0x0 + lVar10);
      if (p->fGiaSimple == 0) {
        uVar7 = (uint)*(undefined8 *)pObj;
        if ((((int)uVar7 < 0) || (uVar7 = uVar7 & 0x1fffffff, uVar7 == 0x1fffffff)) ||
           (uVar7 != ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))) goto LAB_0023e806;
        Gia_ObjSetBufLevel(p,pObj);
        iVar6 = extraout_EDX_01;
      }
      else {
LAB_0023e806:
        iVar6 = (int)*(ulong *)pObj;
        uVar8 = *(ulong *)pObj & 0x1fffffff;
        if (uVar8 == 0x1fffffff || iVar6 < 0) {
          bVar11 = (int)uVar8 == 0x1fffffff;
          if (-1 < iVar6 || bVar11) {
            if ((int)uVar5 <= lVar9) goto LAB_0023e95d;
            pVVar4 = p->vLevels;
            Vec_IntFillExtra(pVVar4,(int)lVar9 + 1,(int)CONCAT71((int7)(uVar8 >> 8),bVar11));
            if (pVVar4->nSize <= lVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar4->pArray[lVar9] = 0;
            iVar6 = extraout_EDX_02;
          }
          else {
            Gia_ObjSetCoLevel(p,pObj);
            iVar6 = extraout_EDX_00;
          }
        }
        else {
          Gia_ObjSetGateLevel(p,pObj);
          iVar6 = extraout_EDX;
        }
      }
      pGVar3 = p->pObjs;
      if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
LAB_0023e95d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar1 = p->nLevels;
      uVar7 = (int)((long)pGVar2 + (lVar10 - (long)pGVar3) >> 2) * -0x55555555;
      pVVar4 = p->vLevels;
      Vec_IntFillExtra(pVVar4,uVar7 + 1,iVar6);
      if (((int)uVar7 < 0) || (pVVar4->nSize <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = pVVar4->pArray[uVar7 & 0x7fffffff];
      if (pVVar4->pArray[uVar7 & 0x7fffffff] < iVar1) {
        iVar6 = iVar1;
      }
      p->nLevels = iVar6;
      lVar9 = lVar9 + 1;
      uVar5 = (ulong)p->nObjs;
      lVar10 = lVar10 + 0xc;
    } while (lVar9 < (long)uVar5);
  }
  return p->nLevels;
}

Assistant:

int Gia_ManLevelNum( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !p->fGiaSimple && Gia_ObjIsBuf(pObj) )
            Gia_ObjSetBufLevel( p, pObj );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ObjSetGateLevel( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjSetCoLevel( p, pObj );
        else
            Gia_ObjSetLevel( p, pObj, 0 );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}